

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_precompile_mod_augments_deviations(lysp_module *pmod,ly_set *mod_set)

{
  lysp_ext_substmt *plVar1;
  void *pvVar2;
  lysp_ext_substmt *plVar3;
  LY_ERR LVar4;
  lysp_ext_instance *plVar5;
  lysp_ext_instance *plVar6;
  void **ppvVar7;
  ulong uVar8;
  lysp_ext_substmt *plVar9;
  void **ppvVar10;
  lysp_node_augment *plVar11;
  lysp_ext_instance *plVar12;
  lys_module *m;
  ly_set set;
  lys_module *local_10f0;
  ly_set local_10e8;
  ly_set *local_10d8;
  lysc_ctx local_10d0;
  
  local_10d8 = mod_set;
  memset(&local_10d0.groupings,0,0x1080);
  local_10e8.size = 0;
  local_10e8.count = 0;
  local_10e8.field_2.dnodes = (lyd_node **)0x0;
  local_10d0.cur_mod = pmod->mod;
  local_10d0.ctx = (local_10d0.cur_mod)->ctx;
  local_10d0.ext = (lysc_ext_instance *)0x0;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  plVar11 = pmod->augments;
  local_10d0.pmod = pmod;
  local_10d0.free_ctx.ctx = local_10d0.ctx;
  if (plVar11 != (lysp_node_augment *)0x0) {
    do {
      lysc_update_path(&local_10d0,(lys_module *)0x0,"{augment}");
      lysc_update_path(&local_10d0,(lys_module *)0x0,(plVar11->field_0).node.name);
      LVar4 = lys_nodeid_mod_check
                        (&local_10d0,(plVar11->field_0).node.name,'\x01',&local_10e8,
                         (lysc_nodeid **)0x0,&local_10f0);
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
      if (LVar4 != LY_SUCCESS) goto LAB_00151929;
      LVar4 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&local_10f0->augmented_by);
      if (LVar4 == LY_EEXIST) {
        if ((ulong)local_10e8._0_8_ >> 0x20 != 0) {
          uVar8 = 0;
          do {
            if (*(char *)&local_10e8.field_2.dnodes[uVar8][2].schema == '\0') goto LAB_001516be;
            uVar8 = uVar8 + 1;
          } while ((ulong)local_10e8._0_8_ >> 0x20 != uVar8);
        }
      }
      else {
LAB_001516be:
        LVar4 = ly_set_merge(local_10d8,&local_10e8,'\0',(_func_void_ptr_void_ptr *)0x0);
        if (LVar4 != LY_SUCCESS) goto LAB_00151929;
      }
      ly_set_erase(&local_10e8,(_func_void_void_ptr *)0x0);
      plVar11 = (lysp_node_augment *)(plVar11->field_0).node.next;
    } while (plVar11 != (lysp_node_augment *)0x0);
  }
  plVar12 = (lysp_ext_instance *)0x0;
  while( true ) {
    if (pmod->deviations == (lysp_deviation *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = pmod->deviations[-1].exts;
    }
    if (plVar5 <= plVar12) {
      plVar12 = (lysp_ext_instance *)0x0;
      goto LAB_00151803;
    }
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{deviation}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,pmod->deviations[(long)plVar12].nodeid);
    LVar4 = lys_nodeid_mod_check
                      (&local_10d0,pmod->deviations[(long)plVar12].nodeid,'\x01',&local_10e8,
                       (lysc_nodeid **)0x0,&local_10f0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if (LVar4 != LY_SUCCESS) break;
    LVar4 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&local_10f0->deviated_by);
    if (LVar4 == LY_EEXIST) {
      if ((ulong)local_10e8._0_8_ >> 0x20 != 0) {
        uVar8 = 0;
        do {
          if (*(char *)&local_10e8.field_2.dnodes[uVar8][2].schema == '\0') goto LAB_001517c6;
          uVar8 = uVar8 + 1;
        } while ((ulong)local_10e8._0_8_ >> 0x20 != uVar8);
      }
    }
    else {
LAB_001517c6:
      LVar4 = ly_set_merge(local_10d8,&local_10e8,'\0',(_func_void_ptr_void_ptr *)0x0);
      if (LVar4 != LY_SUCCESS) break;
    }
    ly_set_erase(&local_10e8,(_func_void_void_ptr *)0x0);
    plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
  }
LAB_00151929:
  ly_set_erase(&local_10e8,(_func_void_void_ptr *)0x0);
  return LVar4;
LAB_00151803:
  plVar5 = pmod->exts;
  if (plVar5 == (lysp_ext_instance *)0x0) {
    plVar6 = (lysp_ext_instance *)0x0;
  }
  else {
    plVar6 = plVar5[-1].exts;
  }
  if (plVar6 <= plVar12) {
    LVar4 = LY_SUCCESS;
    goto LAB_00151929;
  }
  plVar1 = plVar5[(long)plVar12].substmts;
  ppvVar7 = (void **)0xffffffffffffffff;
  plVar3 = plVar1;
  do {
    plVar9 = plVar3;
    if (plVar1 == (lysp_ext_substmt *)0x0) {
      ppvVar10 = (void **)0x0;
    }
    else {
      ppvVar10 = plVar1[-1].storage_p;
    }
    ppvVar7 = (void **)((long)ppvVar7 + 1);
    if (ppvVar10 <= ppvVar7) goto LAB_0015191b;
    plVar3 = plVar9 + 1;
  } while (plVar9->stmt != LY_STMT_AUGMENT);
  pvVar2 = *plVar9->storage_p;
  if (pvVar2 != (void *)0x0) {
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{ext-augment}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,*(char **)((long)pvVar2 + 0x18));
    LVar4 = lys_nodeid_mod_check
                      (&local_10d0,*(char **)((long)pvVar2 + 0x18),'\x01',&local_10e8,
                       (lysc_nodeid **)0x0,&local_10f0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if (LVar4 != LY_SUCCESS) goto LAB_00151929;
    LVar4 = lys_array_add_mod_ref(&local_10d0,pmod->mod,&local_10f0->augmented_by);
    if (LVar4 == LY_EEXIST) {
      if ((ulong)local_10e8._0_8_ >> 0x20 != 0) {
        uVar8 = 0;
        do {
          if (*(char *)&local_10e8.field_2.dnodes[uVar8][2].schema == '\0') goto LAB_001518fc;
          uVar8 = uVar8 + 1;
        } while ((ulong)local_10e8._0_8_ >> 0x20 != uVar8);
      }
    }
    else {
LAB_001518fc:
      LVar4 = ly_set_merge(local_10d8,&local_10e8,'\0',(_func_void_ptr_void_ptr *)0x0);
      if (LVar4 != LY_SUCCESS) goto LAB_00151929;
    }
    ly_set_erase(&local_10e8,(_func_void_void_ptr *)0x0);
  }
LAB_0015191b:
  plVar12 = (lysp_ext_instance *)((long)&plVar12->name + 1);
  goto LAB_00151803;
}

Assistant:

static LY_ERR
lys_precompile_mod_augments_deviations(struct lysp_module *pmod, struct ly_set *mod_set)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysc_ctx ctx = {0};
    struct lys_module *m;
    struct lysp_node_augment *aug;
    struct ly_set set = {0};

    LYSC_CTX_INIT_PMOD(ctx, pmod, NULL);

    LY_LIST_FOR(pmod->augments, aug) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->deviations, u) {
        /* get target module */
        lysc_update_path(&ctx, NULL, "{deviation}");
        lysc_update_path(&ctx, NULL, pmod->deviations[u].nodeid);
        ret = lys_nodeid_mod_check(&ctx, pmod->deviations[u].nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module deviated_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->deviated_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

    LY_ARRAY_FOR(pmod->exts, u) {
        aug = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug) {
            continue;
        }

        /* get target module */
        lysc_update_path(&ctx, NULL, "{ext-augment}");
        lysc_update_path(&ctx, NULL, aug->nodeid);
        ret = lys_nodeid_mod_check(&ctx, aug->nodeid, 1, &set, NULL, &m);
        lysc_update_path(&ctx, NULL, NULL);
        lysc_update_path(&ctx, NULL, NULL);
        LY_CHECK_GOTO(ret, cleanup);

        /* add this module into the target module augmented_by, if not there and implemented */
        if ((lys_array_add_mod_ref(&ctx, pmod->mod, &m->augmented_by) != LY_EEXIST) ||
                !lys_precompile_mod_set_is_all_implemented(&set)) {
            LY_CHECK_GOTO(ret = ly_set_merge(mod_set, &set, 0, NULL), cleanup);
        }
        ly_set_erase(&set, NULL);
    }

cleanup:
    ly_set_erase(&set, NULL);
    return ret;
}